

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall
UtestShell::assertCstrNEqual
          (UtestShell *this,char *expected,char *actual,size_t length,char *text,char *fileName,
          size_t lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString local_a8;
  TestFailure local_98;
  TestResult *pTVar2;
  
  pTVar2 = testResult_;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x2a])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  (*pTVar2->_vptr_TestResult[10])();
  if (expected != (char *)0x0 || actual != (char *)0x0) {
    if (expected == (char *)0x0 || actual == (char *)0x0) {
      SimpleString::SimpleString(&local_a8,text);
      StringEqualFailure::StringEqualFailure
                ((StringEqualFailure *)&local_98,this,fileName,lineNumber,expected,actual,&local_a8)
      ;
      (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&local_a8);
    }
    iVar1 = SimpleString::StrNCmp(expected,actual,length);
    if (iVar1 != 0) {
      SimpleString::SimpleString(&local_a8,text);
      StringEqualFailure::StringEqualFailure
                ((StringEqualFailure *)&local_98,this,fileName,lineNumber,expected,actual,&local_a8)
      ;
      (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&local_a8);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNEqual(const char* expected, const char* actual, size_t length, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(StringEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
    if (SimpleString::StrNCmp(expected, actual, length) != 0)
        failWith(StringEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
}